

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O2

bool __thiscall
double_conversion::DoubleToStringConverter::ToFixed
          (DoubleToStringConverter *this,double value,int requested_digits,
          StringBuilder *result_builder)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  long in_FS_OFFSET;
  int decimal_rep_length;
  bool sign;
  int decimal_point;
  char decimal_rep [161];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    bVar3 = false;
    if ((requested_digits < 0x65) && (bVar3 = false, ABS(value) < 1e+60)) {
      decimal_point = -0x55555556;
      sign = true;
      memset(decimal_rep,0xaa,0xa1);
      decimal_rep_length = -0x55555556;
      DoubleToAscii(value,FIXED,requested_digits,decimal_rep,0xa1,&sign,&decimal_rep_length,
                    &decimal_point);
      if ((sign == true) && (value != 0.0 || (this->flags_ & 8U) == 0)) {
        iVar1 = *(int *)(result_builder + 0x10);
        *(int *)(result_builder + 0x10) = iVar1 + 1;
        *(undefined1 *)(*(long *)result_builder + (long)iVar1) = 0x2d;
      }
      CreateDecimalRepresentation
                (this,decimal_rep,decimal_rep_length,decimal_point,requested_digits,result_builder);
      bVar3 = true;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return bVar3;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    bVar3 = HandleSpecialValues(this,value,result_builder);
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool DoubleToStringConverter::ToFixed(double value,
                                      int requested_digits,
                                      StringBuilder* result_builder) const {
  DOUBLE_CONVERSION_ASSERT(kMaxFixedDigitsBeforePoint == 60);
  const double kFirstNonFixed = 1e60;

  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (requested_digits > kMaxFixedDigitsAfterPoint) return false;
  if (value >= kFirstNonFixed || value <= -kFirstNonFixed) return false;

  // Find a sufficiently precise decimal representation of n.
  int decimal_point;
  bool sign;
  // Add space for the '\0' byte.
  const int kDecimalRepCapacity =
      kMaxFixedDigitsBeforePoint + kMaxFixedDigitsAfterPoint + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;
  DoubleToAscii(value, FIXED, requested_digits,
                decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  CreateDecimalRepresentation(decimal_rep, decimal_rep_length, decimal_point,
                              requested_digits, result_builder);
  return true;
}